

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_crl.cpp
# Opt level: O3

void WriteGeneralName(GeneralName *name)

{
  size_type *psVar1;
  GeneralNameType GVar2;
  ostream *poVar3;
  stringstream local_218 [8];
  stringstream strstm;
  ostream local_208 [112];
  ios_base local_198 [264];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 local_70 [8];
  IA5String uri;
  string str;
  
  GVar2 = GeneralName::GetType(name);
  if (GVar2 == uniformResourceIdentifier) {
    psVar1 = &uri.value._M_string_length;
    uri.super_DerBase._vptr_DerBase = (_func_int **)0x0;
    local_70 = (undefined1  [8])&PTR_EncodedSize_00151b48;
    uri.value._M_dataplus._M_p = (pointer)0x0;
    uri.value._M_string_length._0_1_ = 0;
    str._M_dataplus._M_p = (pointer)0x0;
    str._M_string_length._0_1_ = 0;
    uri.super_DerBase.cbData = (size_t)psVar1;
    uri.value.field_2._8_8_ = &str._M_string_length;
    GVar2 = GeneralName::GetType(name);
    if (GVar2 == uniformResourceIdentifier) {
      AnyType::ConvertToType<IA5String>(&(name->super_ChoiceType).value,(IA5String *)local_70);
    }
    std::__cxx11::stringstream::stringstream(local_218);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_208,(char *)uri.super_DerBase.cbData,(long)uri.value._M_dataplus._M_p);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=
              ((string *)(uri.value.field_2._M_local_buf + 8),(string *)local_90);
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CRL URI: ",9);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)uri.value.field_2._8_8_,
                        (long)str._M_dataplus._M_p);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__cxx11::stringstream::~stringstream(local_218);
    std::ios_base::~ios_base(local_198);
    if ((size_type *)uri.value.field_2._8_8_ != &str._M_string_length) {
      operator_delete((void *)uri.value.field_2._8_8_);
    }
    if ((size_type *)uri.super_DerBase.cbData != psVar1) {
      operator_delete((void *)uri.super_DerBase.cbData);
    }
  }
  return;
}

Assistant:

void WriteGeneralName(const GeneralName& name)
{
    GeneralNameType type = name.GetType();

    switch(type)
    {
        case GeneralNameType::uniformResourceIdentifier:
            break;
            
        case GeneralNameType::OtherName:
        case GeneralNameType::rfc822Name:
        case GeneralNameType::dNSName:
        case GeneralNameType::x400Address:
        case GeneralNameType::directoryName:
        case GeneralNameType::ediPartyName:
        case GeneralNameType::iPAddress:
        case GeneralNameType::registeredID:
        default:
            return;
    }

    IA5String uri;
    std::string str;

    name.GetURI(uri);
    std::stringstream strstm;
    strstm << uri;
    str = strstm.str();

    std::cout << "CRL URI: " << str << std::endl;
}